

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

void canvas_vis(_glist *x,t_floatarg f)

{
  int iVar1;
  _undo *p_Var2;
  void *old;
  void *pvVar3;
  char *pcVar4;
  char *pcVar5;
  _undo_action *p_Var6;
  _glist *p_Var7;
  _glist *gl2;
  long lVar8;
  char winpos [128];
  char local_a8 [128];
  
  if ((f != 0.0) || (NAN(f))) {
    if ((x->gl_editor != (t_editor *)0x0) && ((x->field_0xe8 & 1) != 0)) {
      pdgui_vmess("pdtk_canvas_raise","^",x);
      return;
    }
    p_Var2 = canvas_undo_get(x);
    if (p_Var2 == (_undo *)0x0) {
      p_Var6 = (_undo_action *)0x0;
    }
    else {
      p_Var6 = p_Var2->u_last;
    }
    old = getbytes(0);
    canvas_create_editor(x);
    if ((x->gl_screenx1 == 0) && (x->gl_screeny1 == 0x32)) {
      local_a8[0] = '\0';
    }
    else {
      sprintf(local_a8,"+%d+%d",(ulong)(uint)x->gl_screenx1,(ulong)(uint)x->gl_screeny1);
    }
    lVar8 = 0;
    pdgui_vmess("pdtk_canvas_new","^ ii si",x,(ulong)(uint)(x->gl_screenx2 - x->gl_screenx1),
                (ulong)(uint)(x->gl_screeny2 - x->gl_screeny1),local_a8,
                *(uint *)&x->field_0xe8 >> 5 & 1);
    p_Var7 = x;
    while (((p_Var7->gl_owner != (_glist *)0x0 && ((p_Var7->field_0xe9 & 8) == 0)) &&
           (pvVar3 = resizebytes(old,lVar8 * 8,lVar8 * 8 + 8), pvVar3 != (void *)0x0))) {
      p_Var7 = p_Var7->gl_owner;
      *(_glist **)((long)pvVar3 + lVar8 * 8) = p_Var7;
      lVar8 = lVar8 + 1;
      old = pvVar3;
    }
    pdgui_vmess("pdtk_canvas_setparents","^C",x,lVar8,old);
    freebytes(old,lVar8 * 0xf8);
    x->field_0xe8 = x->field_0xe8 | 1;
    canvas_reflecttitle(x);
    canvas_updatewindowlist();
    pcVar5 = "no";
    pcVar4 = "no";
    if (p_Var6 != (_undo_action *)0x0) {
      pcVar4 = p_Var6->name;
      if (p_Var6->next != (_undo_action *)0x0) {
        pcVar5 = p_Var6->next->name;
      }
    }
    pdgui_vmess("pdtk_undomenu","^ ss",x,pcVar4,pcVar5);
  }
  else {
    if ((x->field_0xe8 & 1) != 0) {
      glist_noselect(x);
      iVar1 = glist_isvisible(x);
      if (iVar1 != 0) {
        canvas_map(x,0.0);
      }
      canvas_destroy_editor(x);
      pdgui_vmess("destroy","^",x);
      iVar1 = glist_isgraph(x);
      if (((iVar1 == 0) || (p_Var7 = x->gl_owner, p_Var7 == (_glist *)0x0)) ||
         ((x->field_0xe9 & 8) != 0)) {
        x->field_0xe8 = x->field_0xe8 & 0xfe;
      }
      else {
        iVar1 = glist_isvisible(p_Var7);
        if (iVar1 != 0) {
          gobj_vis((t_gobj *)x,p_Var7,0);
        }
        x->field_0xe8 = x->field_0xe8 & 0xfe;
        iVar1 = glist_isvisible(p_Var7);
        if ((iVar1 != 0) && ((p_Var7->field_0xe8 & 0x40) == 0)) {
          if (x->gl_zoom != p_Var7->gl_zoom) {
            canvas_zoom(x,(float)p_Var7->gl_zoom);
          }
          gobj_vis((t_gobj *)x,p_Var7,1);
        }
      }
      canvas_updatewindowlist();
      return;
    }
    if (x->gl_editor != (t_editor *)0x0) {
      canvas_destroy_editor(x);
      return;
    }
  }
  return;
}

Assistant:

void canvas_vis(t_canvas *x, t_floatarg f)
{
    int flag = (f != 0);
    if (flag)
    {
            /* If a subpatch/abstraction has GOP/gl_isgraph set, then it will have
             * a gl_editor already, if its not, it will not have a gl_editor.
             * canvas_create_editor(x) checks if a gl_editor is already created,
             * so its ok to run it on a canvas that already has a gl_editor. */
        if (x->gl_editor && x->gl_havewindow)
        {           /* just put us in front */
            pdgui_vmess("pdtk_canvas_raise", "^", x);
        }
        else
        {
            char cbuf[MAXPDSTRING];
            t_canvas *c = x;
            t_undo *undo = canvas_undo_get(x);
            t_undo_action *udo = undo ? undo->u_last : 0;
            char winpos[128];
            t_canvas**parents = getbytes(0);
            size_t numparents;

            canvas_create_editor(x);
            if ((GLIST_DEFCANVASXLOC == x->gl_screenx1) && (GLIST_DEFCANVASYLOC == x->gl_screeny1)) /* initial values for new windows */
            {
                winpos[0]=0;
            } else {
                sprintf(winpos, "+%d+%d", (int)(x->gl_screenx1), (int)(x->gl_screeny1));
            }

            pdgui_vmess("pdtk_canvas_new", "^ ii si", x,
                (int)(x->gl_screenx2 - x->gl_screenx1),
                (int)(x->gl_screeny2 - x->gl_screeny1),
                winpos, x->gl_edit);

            numparents = 0;
            while (c->gl_owner && !c->gl_isclone) {
                t_canvas**newparents = (t_canvas**)resizebytes(parents, numparents * sizeof(*newparents), (numparents+1) * sizeof(*newparents));
                if (!newparents)
                    break;
                c = c->gl_owner;
                parents = newparents;
                parents[numparents] = c;
                numparents++;
            }
            pdgui_vmess("pdtk_canvas_setparents", "^C", x, numparents, parents);
            freebytes(parents, numparents * sizeof(t_canvas));

            x->gl_havewindow = 1;
            canvas_reflecttitle(x);
            canvas_updatewindowlist();
            pdgui_vmess("pdtk_undomenu", "^ ss",
                x,
                udo?(udo->name):"no",
                (udo && udo->next)?(udo->next->name):"no");
        }
    }
    else    /* make invisible */
    {
        int i;
        t_canvas *x2;
        if (!x->gl_havewindow)
        {
                /* bug workaround -- a graph in a visible patch gets "invised"
                   when the patch is closed, and must lose the editor here.  It's
                   probably not the natural place to do this.  Other cases like
                   subpatches fall here too but don'd need the editor freed, so
                   we check if it exists. */
            if (x->gl_editor)
                canvas_destroy_editor(x);
            return;
        }
        glist_noselect(x);
        if (glist_isvisible(x))
            canvas_map(x, 0);
        canvas_destroy_editor(x);
        pdgui_vmess("destroy", "^", x);
        for (i = 1, x2 = x; x2; x2 = x2->gl_next, i++)
            ;
            /* if we're a graph on our parent, and if the parent exists
               and is visible, show ourselves on parent. */
        if (glist_isgraph(x) && x->gl_owner && !x->gl_isclone)
        {
            t_glist *gl2 = x->gl_owner;
            if (glist_isvisible(gl2))
                gobj_vis(&x->gl_gobj, gl2, 0);
            x->gl_havewindow = 0;
            if (glist_isvisible(gl2) && !gl2->gl_isdeleting)
            {
                    /* make sure zoom level matches parent, ie. after an open
                       subpatch's zoom level was changed before being closed */
                if(x->gl_zoom != gl2->gl_zoom)
                    canvas_zoom(x, gl2->gl_zoom);
                gobj_vis(&x->gl_gobj, gl2, 1);
            }
        }
        else x->gl_havewindow = 0;
        canvas_updatewindowlist();
    }
}